

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

uint8_t * get_ls_tile_buffers(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,
                             TileBufferDec (*tile_buffers) [64])

{
  aom_internal_error_info *paVar1;
  uint uVar2;
  uint uVar3;
  int sz;
  int sz_00;
  _Bool _Var4;
  uint uVar5;
  long lVar6;
  long lVar7;
  size_t *psVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint8_t *puVar19;
  ulong uVar20;
  long lVar21;
  uint8_t *puVar22;
  size_t *psVar23;
  int tile_height;
  int tile_width;
  uint8_t *tile_col_data_end [64];
  int local_260;
  int local_25c;
  long local_258;
  size_t *local_250;
  ulong local_248 [67];
  
  uVar17 = (pbi->common).tiles.cols;
  uVar2 = (pbi->common).tiles.rows;
  if ((int)(uVar2 * uVar17) < 2) {
    (*tile_buffers)[0].data = data;
    (*tile_buffers)[0].size = (long)data_end - (long)data;
    data = (uint8_t *)0x0;
  }
  else {
    lVar18 = (long)(int)uVar17;
    memset(local_248 + 2,0,0x200);
    uVar3 = pbi->dec_tile_row;
    uVar5 = pbi->dec_tile_col;
    uVar11 = uVar2;
    if ((int)uVar3 < (int)uVar2) {
      uVar11 = uVar3;
    }
    uVar16 = uVar17;
    if ((int)uVar5 < (int)uVar17) {
      uVar16 = uVar5;
    }
    uVar9 = uVar16 + 1;
    if ((int)uVar5 < 0) {
      uVar9 = uVar17;
      uVar16 = 0;
    }
    sz = pbi->tile_col_size_bytes;
    lVar6 = (long)sz;
    sz_00 = pbi->tile_size_bytes;
    lVar7 = (long)sz_00;
    _Var4 = av1_get_uniform_tile_size(&pbi->common,&local_25c,&local_260);
    if (!_Var4) {
      aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,
                         "Not all the tiles in the tile list have the same size.");
    }
    iVar10 = local_260;
    if (local_260 < local_25c) {
      iVar10 = local_25c;
    }
    if (0 < (int)uVar17) {
      uVar13 = 0;
      puVar19 = data;
      do {
        if (uVar17 - 1 == uVar13) {
          sVar12 = (long)data_end - (long)puVar19;
          puVar22 = data_end;
        }
        else {
          if ((long)data_end - (long)puVar19 < lVar6) {
            aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,
                               "Not enough data to read tile_col_size");
          }
          sVar12 = mem_get_varsize(puVar19,sz);
          puVar19 = puVar19 + lVar6;
          if ((ulong)((long)data_end - (long)puVar19) < sVar12) {
            aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,
                               "tile_col_data_end[%d] is out of bound",uVar13 & 0xffffffff);
          }
          puVar22 = puVar19 + sVar12;
        }
        puVar19 = puVar19 + sVar12;
        local_248[uVar13 + 2] = (ulong)puVar22;
        uVar13 = uVar13 + 1;
      } while (uVar17 != uVar13);
    }
    if ((int)uVar16 < (int)uVar9) {
      local_258 = lVar18 + -1;
      paVar1 = &pbi->error;
      local_248[1] = (ulong)(sz_00 * 8 - 1);
      local_248[0] = (ulong)(sz_00 * 8 - 8);
      lVar15 = (long)(int)uVar16;
      psVar23 = &(*tile_buffers)[lVar15].size;
      do {
        if (0 < lVar15) {
          data = (uint8_t *)local_248[lVar15 + 1];
        }
        uVar5 = uVar11 + 1;
        if ((int)uVar3 < 0) {
          uVar5 = uVar2;
        }
        lVar21 = lVar6;
        if (lVar15 == local_258) {
          lVar21 = 0;
          uVar5 = uVar2;
        }
        data = data + lVar21;
        local_250 = psVar23;
        if (0 < (int)uVar5) {
          uVar13 = local_248[lVar15 + 2];
          uVar14 = 0;
          do {
            if (uVar13 - (long)data <= lVar7 - 1U) {
              aom_internal_error(paVar1,AOM_CODEC_CORRUPT_FRAME,
                                 "Truncated packet or corrupt tile length");
            }
            sVar12 = mem_get_varsize(data,sz_00);
            if ((iVar10 << 2 < 0x101) && (sVar12 >> ((byte)local_248[1] & 0x3f) == 1)) {
              uVar16 = (uint)(sVar12 >> ((byte)local_248[0] & 0x3f));
              if (uVar14 < (uVar16 & 0x7f)) {
                aom_internal_error(paVar1,AOM_CODEC_CORRUPT_FRAME,
                                   "Invalid row offset in tile copy mode: row=%d offset=%d",
                                   uVar14 & 0xffffffff);
              }
              psVar8 = (size_t *)((long)psVar23 - (ulong)((uVar16 & 0x7f) << 10));
              puVar19 = (uint8_t *)psVar8[-1];
              sVar12 = *psVar8;
              uVar20 = 0;
            }
            else {
              uVar20 = sVar12 + 1;
              sVar12 = 0;
              puVar19 = (uint8_t *)0x0;
            }
            puVar22 = data + lVar7;
            if (uVar13 - (long)puVar22 < uVar20) {
              aom_internal_error(paVar1,AOM_CODEC_CORRUPT_FRAME,
                                 "Truncated packet or corrupt tile size");
            }
            if (uVar20 != 0) {
              sVar12 = uVar20;
              puVar19 = puVar22;
            }
            ((TileBufferDec *)(psVar23 + -1))->data = puVar19;
            *psVar23 = sVar12;
            data = puVar22 + uVar20;
            uVar14 = uVar14 + 1;
            psVar23 = psVar23 + 0x80;
          } while (uVar5 != uVar14);
        }
        lVar15 = lVar15 + 1;
        psVar23 = local_250 + 2;
      } while (uVar9 != (uint)lVar15);
    }
    if ((uVar9 != uVar17) && (data = (uint8_t *)local_248[lVar18], 0 < (int)uVar2)) {
      uVar13 = local_248[lVar18 + 1];
      paVar1 = &pbi->error;
      psVar23 = &tile_buffers[-1][lVar18 + 0x3f].size;
      uVar14 = 0;
      do {
        if (uVar13 - (long)data <= lVar7 - 1U) {
          aom_internal_error(paVar1,AOM_CODEC_CORRUPT_FRAME,
                             "Truncated packet or corrupt tile length");
        }
        sVar12 = mem_get_varsize(data,sz_00);
        if ((iVar10 << 2 < 0x101) && (sVar12 >> ((char)sz_00 * '\b' - 1U & 0x3f) == 1)) {
          uVar17 = (uint)(sVar12 >> ((char)sz_00 * '\b' - 8U & 0x3f));
          if (uVar14 < (uVar17 & 0x7f)) {
            aom_internal_error(paVar1,AOM_CODEC_CORRUPT_FRAME,
                               "Invalid row offset in tile copy mode: row=%d offset=%d",
                               uVar14 & 0xffffffff);
          }
          psVar8 = (size_t *)((long)psVar23 - (ulong)((uVar17 & 0x7f) << 10));
          puVar19 = (uint8_t *)psVar8[-1];
          sVar12 = *psVar8;
          uVar20 = 0;
        }
        else {
          uVar20 = sVar12 + 1;
          sVar12 = 0;
          puVar19 = (uint8_t *)0x0;
        }
        puVar22 = data + lVar7;
        if (uVar13 - (long)puVar22 < uVar20) {
          aom_internal_error(paVar1,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile size")
          ;
        }
        if (uVar20 != 0) {
          sVar12 = uVar20;
          puVar19 = puVar22;
        }
        ((TileBufferDec *)(psVar23 + -1))->data = puVar19;
        *psVar23 = sVar12;
        data = puVar22 + uVar20;
        uVar14 = uVar14 + 1;
        psVar23 = psVar23 + 0x80;
      } while (uVar2 != uVar14);
    }
  }
  return data;
}

Assistant:

static const uint8_t *get_ls_tile_buffers(
    AV1Decoder *pbi, const uint8_t *data, const uint8_t *data_end,
    TileBufferDec (*const tile_buffers)[MAX_TILE_COLS]) {
  AV1_COMMON *const cm = &pbi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int have_tiles = tile_cols * tile_rows > 1;
  const uint8_t *raw_data_end;  // The end of the last tile buffer

  if (!have_tiles) {
    const size_t tile_size = data_end - data;
    tile_buffers[0][0].data = data;
    tile_buffers[0][0].size = tile_size;
    raw_data_end = NULL;
  } else {
    // We locate only the tile buffers that are required, which are the ones
    // specified by pbi->dec_tile_col and pbi->dec_tile_row. Also, we always
    // need the last (bottom right) tile buffer, as we need to know where the
    // end of the compressed frame buffer is for proper superframe decoding.

    const uint8_t *tile_col_data_end[MAX_TILE_COLS] = { NULL };
    const uint8_t *const data_start = data;

    const int dec_tile_row = AOMMIN(pbi->dec_tile_row, tile_rows);
    const int single_row = pbi->dec_tile_row >= 0;
    const int tile_rows_start = single_row ? dec_tile_row : 0;
    const int tile_rows_end = single_row ? tile_rows_start + 1 : tile_rows;
    const int dec_tile_col = AOMMIN(pbi->dec_tile_col, tile_cols);
    const int single_col = pbi->dec_tile_col >= 0;
    const int tile_cols_start = single_col ? dec_tile_col : 0;
    const int tile_cols_end = single_col ? tile_cols_start + 1 : tile_cols;

    const int tile_col_size_bytes = pbi->tile_col_size_bytes;
    const int tile_size_bytes = pbi->tile_size_bytes;
    int tile_width, tile_height;
    if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
      aom_internal_error(
          &pbi->error, AOM_CODEC_CORRUPT_FRAME,
          "Not all the tiles in the tile list have the same size.");
    }
    const int tile_copy_mode =
        ((AOMMAX(tile_width, tile_height) << MI_SIZE_LOG2) <= 256) ? 1 : 0;
    // Read tile column sizes for all columns (we need the last tile buffer)
    for (int c = 0; c < tile_cols; ++c) {
      const int is_last = c == tile_cols - 1;
      size_t tile_col_size;

      if (!is_last) {
        if (tile_col_size_bytes > data_end - data) {
          aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                             "Not enough data to read tile_col_size");
        }
        tile_col_size = mem_get_varsize(data, tile_col_size_bytes);
        data += tile_col_size_bytes;
        if (tile_col_size > (size_t)(data_end - data)) {
          aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                             "tile_col_data_end[%d] is out of bound", c);
        }
        tile_col_data_end[c] = data + tile_col_size;
      } else {
        tile_col_size = data_end - data;
        tile_col_data_end[c] = data_end;
      }
      data += tile_col_size;
    }

    data = data_start;

    // Read the required tile sizes.
    for (int c = tile_cols_start; c < tile_cols_end; ++c) {
      const int is_last = c == tile_cols - 1;

      if (c > 0) data = tile_col_data_end[c - 1];

      if (!is_last) data += tile_col_size_bytes;

      // Get the whole of the last column, otherwise stop at the required tile.
      for (int r = 0; r < (is_last ? tile_rows : tile_rows_end); ++r) {
        get_ls_tile_buffer(tile_col_data_end[c], &pbi->error, &data,
                           tile_buffers, tile_size_bytes, c, r, tile_copy_mode);
      }
    }

    // If we have not read the last column, then read it to get the last tile.
    if (tile_cols_end != tile_cols) {
      const int c = tile_cols - 1;

      data = tile_col_data_end[c - 1];

      for (int r = 0; r < tile_rows; ++r) {
        get_ls_tile_buffer(tile_col_data_end[c], &pbi->error, &data,
                           tile_buffers, tile_size_bytes, c, r, tile_copy_mode);
      }
    }
    raw_data_end = data;
  }
  return raw_data_end;
}